

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void kj::anon_unknown_70::terminateHandler(void)

{
  ArrayPtr<void_*const> trace;
  undefined8 uVar1;
  size_t in_RCX;
  Array<char> *params_1;
  void *__buf;
  char *pcVar2;
  char *in_R9;
  ArrayPtr<void_*const> AVar3;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> trace_00;
  size_t in_stack_fffffffffffffe38;
  Array<char> local_1b0;
  Array<char> local_198;
  Array<char> local_180;
  String message;
  exception_ptr eptr;
  String local_148;
  undefined1 local_130 [8];
  void *traceSpace [32];
  
  memset((kj *)traceSpace,0,0x100);
  space.size_ = 3;
  space.ptr = (void **)0x20;
  AVar3 = getStackTrace((kj *)traceSpace,space,(uint)in_RCX);
  trace_00.ptr = (void **)AVar3.size_;
  message.content.ptr = (char *)0x0;
  message.content.size_ = 0;
  message.content.disposer = (ArrayDisposer *)0x0;
  std::current_exception();
  local_1b0.ptr = (char *)0x0;
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&local_1b0);
  if (eptr._M_exception_object == (void *)0x0) {
    trace.size_ = in_stack_fffffffffffffe38;
    trace.ptr = (void **)0x244218;
    stringifyStackTraceAddresses(trace);
    trace_00.size_ = in_RCX;
    stringifyStackTrace((String *)&local_180,(kj *)AVar3.ptr,trace_00);
    local_148.content.ptr._0_1_ = 10;
    params_1 = &local_180;
    str<char_const(&)[54],kj::String,kj::String,char>
              ((String *)&local_1b0,(kj *)"*** std::terminate() called with no exception\nstack: ",
               (char (*) [54])&local_198,(String *)params_1,&local_148,in_R9);
    Array<char>::operator=(&message.content,&local_1b0);
    Array<char>::~Array(&local_1b0);
    Array<char>::~Array(&local_180);
    Array<char>::~Array(&local_198);
    local_1b0.ptr = (char *)&PTR__FdOutputStream_0036e7c0;
    local_1b0.size_ = 0xffffffff00000002;
    pcVar2 = (char *)message.content.size_;
    if (message.content.size_ != 0) {
      pcVar2 = message.content.ptr;
    }
    __buf = (void *)0x0;
    if (message.content.size_ != 0) {
      __buf = (void *)(message.content.size_ - 1);
    }
    FdOutputStream::write((FdOutputStream *)&local_1b0,(int)pcVar2,__buf,(size_t)params_1);
    FdOutputStream::~FdOutputStream((FdOutputStream *)&local_1b0);
    _exit(1);
  }
  std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_130,&eptr);
  uVar1 = std::rethrow_exception((exception_ptr)local_130);
  Array<char>::~Array(&local_1b0);
  Array<char>::~Array(&local_180);
  Array<char>::~Array(&local_198);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eptr);
  Array<char>::~Array(&message.content);
  _Unwind_Resume(uVar1);
}

Assistant:

[[noreturn]] void terminateHandler() {
  void* traceSpace[32]{};

  // ignoreCount = 3 to ignore std::terminate entry.
  auto trace = kj::getStackTrace(traceSpace, 3);

  kj::String message;

  auto eptr = std::current_exception();
  if (eptr != nullptr) {
    try {
      std::rethrow_exception(eptr);
    } catch (const kj::Exception& exception) {
      message = kj::str("*** Fatal uncaught kj::Exception: ", exception, '\n');
    } catch (const std::exception& exception) {
      message = kj::str("*** Fatal uncaught std::exception: ", exception.what(),
                        "\nstack: ", stringifyStackTraceAddresses(trace),
                                     stringifyStackTrace(trace), '\n');
    } catch (...) {
      message = kj::str("*** Fatal uncaught exception of type: ", kj::getCaughtExceptionType(),
                        "\nstack: ", stringifyStackTraceAddresses(trace),
                                     stringifyStackTrace(trace), '\n');
    }
  } else {
    message = kj::str("*** std::terminate() called with no exception"
                      "\nstack: ", stringifyStackTraceAddresses(trace),
                                   stringifyStackTrace(trace), '\n');
  }

  kj::FdOutputStream(STDERR_FILENO).write(message.asBytes());
  _exit(1);
}